

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize_tests.cpp
# Opt level: O3

void __thiscall cluster_linearize_tests::depgraph_ser_tests::test_method(depgraph_ser_tests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  long in_FS_OFFSET;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_00;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_01;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_02;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_03;
  allocator_type local_d1;
  string local_d0;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined1 local_58 [40];
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_58._16_8_ = (pointer)0x0;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"00","");
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)local_58,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT44(local_d0.field_2._M_allocated_capacity._4_4_,
                             local_d0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
  }
  local_30.first.fee = 0;
  local_30.first.size = 1;
  local_30.second.m_val = 0;
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)local_58,__l,&local_d1);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"01000000","");
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)local_58,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT44(local_d0.field_2._M_allocated_capacity._4_4_,
                             local_d0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
  }
  local_d0._M_dataplus._M_p = (pointer)0x2a;
  local_d0._M_string_length._0_4_ = 0xb;
  local_d0.field_2._M_allocated_capacity._0_4_ = 0;
  local_d0.field_2._8_8_ = 0xfffffffffffffff3;
  local_b0 = 7;
  local_a8 = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_d0;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_30,__l_00,&local_d1);
  ppVar2 = (pointer)(local_58 + 0x10);
  local_58._0_8_ = ppVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"0b54000719000000","");
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_30,(string *)local_58);
  if ((pointer)local_58._0_8_ != ppVar2) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
  }
  if ((void *)local_30.first.fee != (void *)0x0) {
    operator_delete((void *)local_30.first.fee,
                    CONCAT44(local_30._20_4_,local_30.second.m_val) - local_30.first.fee);
  }
  local_d0._M_dataplus._M_p = (pointer)0x40;
  local_d0._M_string_length._0_4_ = 0x80;
  local_d0.field_2._M_allocated_capacity._0_4_ = 0;
  local_d0.field_2._8_8_ = 0x80;
  local_b0 = 0x100;
  local_a8 = 0;
  local_a0 = 1;
  local_98 = 1;
  local_90 = 3;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_d0;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_30,__l_01,&local_d1);
  local_58._0_8_ = ppVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"80008000008100810001010200000000","");
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_30,(string *)local_58);
  if ((pointer)local_58._0_8_ != ppVar2) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
  }
  if ((void *)local_30.first.fee != (void *)0x0) {
    operator_delete((void *)local_30.first.fee,
                    CONCAT44(local_30._20_4_,local_30.second.m_val) - local_30.first.fee);
  }
  local_d0._M_dataplus._M_p = (pointer)0x39;
  local_d0._M_string_length._0_4_ = 0x72;
  local_d0.field_2._M_allocated_capacity._0_4_ = 2;
  local_d0.field_2._8_8_ = 0xffffffffffffffc7;
  local_b0 = 0x71;
  local_a8 = 0;
  local_a0 = 0xffffffffffffffc6;
  local_98 = 0x73;
  local_90 = 2;
  local_88 = 0x3a;
  local_80 = 0x74;
  local_78 = 4;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_d0;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_30,__l_02,&local_d1);
  local_58._0_8_ = ppVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"71710072720001737301007474000100","");
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_30,(string *)local_58);
  if ((pointer)local_58._0_8_ != ppVar2) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
  }
  if ((void *)local_30.first.fee != (void *)0x0) {
    operator_delete((void *)local_30.first.fee,
                    CONCAT44(local_30._20_4_,local_30.second.m_val) - local_30.first.fee);
  }
  local_d0._M_dataplus._M_p = (pointer)0x1;
  local_d0._M_string_length._0_4_ = 3;
  local_d0.field_2._M_allocated_capacity._0_4_ = 6;
  local_d0.field_2._8_8_ = 1;
  local_b0 = 2;
  local_a8 = 0;
  local_a0 = 3;
  local_98 = 1;
  local_90 = 0;
  local_88 = 1;
  local_80 = 1;
  local_78 = 1;
  local_70 = 2;
  local_68 = 1;
  local_60 = 2;
  __l_03._M_len = 5;
  __l_03._M_array = (iterator)&local_d0;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_30,__l_03,&local_d1);
  local_58._0_8_ = ppVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"0202000106010104010003020100030102000200","");
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_30,(string *)local_58);
  if ((pointer)local_58._0_8_ != ppVar2) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
  }
  if ((void *)local_30.first.fee != (void *)0x0) {
    operator_delete((void *)local_30.first.fee,
                    CONCAT44(local_30._20_4_,local_30.second.m_val) - local_30.first.fee);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(depgraph_ser_tests)
{
    // Empty cluster.
    TestDepGraphSerialization<TestBitSet>(
        {},
        "00" /* end of graph */);

    // Transactions: A(fee=0,size=1).
    TestDepGraphSerialization<TestBitSet>(
        {{{0, 1}, {}}},
        "01" /* A size */
        "00" /* A fee */
        "00" /* A insertion position (no skips): A */
        "00" /* end of graph */);

    // Transactions: A(fee=42,size=11), B(fee=-13,size=7), B depends on A.
    TestDepGraphSerialization<TestBitSet>(
        {{{42, 11}, {}}, {{-13, 7}, {0}}},
        "0b" /* A size */
        "54" /* A fee */
        "00" /* A insertion position (no skips): A */
        "07" /* B size */
        "19" /* B fee */
        "00" /* B->A dependency (no skips) */
        "00" /* B insertion position (no skips): A,B */
        "00" /* end of graph */);

    // Transactions: A(64,128), B(128,256), C(1,1), C depends on A and B.
    TestDepGraphSerialization<TestBitSet>(
        {{{64, 128}, {}}, {{128, 256}, {}}, {{1, 1}, {0, 1}}},
        "8000" /* A size */
        "8000" /* A fee */
        "00"   /* A insertion position (no skips): A */
        "8100" /* B size */
        "8100" /* B fee */
        "01"   /* B insertion position (skip B->A dependency): A,B */
        "01"   /* C size */
        "02"   /* C fee */
        "00"   /* C->B dependency (no skips) */
        "00"   /* C->A dependency (no skips) */
        "00"   /* C insertion position (no skips): A,B,C */
        "00"   /* end of graph */);

    // Transactions: A(-57,113), B(57,114), C(-58,115), D(58,116). Deps: B->A, C->A, D->C, in order
    // [B,A,C,D]. This exercises non-topological ordering (internally serialized as A,B,C,D).
    TestDepGraphSerialization<TestBitSet>(
        {{{57, 114}, {1}}, {{-57, 113}, {}}, {{-58, 115}, {1}}, {{58, 116}, {2}}},
        "71" /* A size */
        "71" /* A fee */
        "00" /* A insertion position (no skips): A */
        "72" /* B size */
        "72" /* B fee */
        "00" /* B->A dependency (no skips) */
        "01" /* B insertion position (skip A): B,A */
        "73" /* C size */
        "73" /* C fee */
        "01" /* C->A dependency (skip C->B dependency) */
        "00" /* C insertion position (no skips): B,A,C */
        "74" /* D size */
        "74" /* D fee */
        "00" /* D->C dependency (no skips) */
        "01" /* D insertion position (skip D->B dependency, D->A is implied): B,A,C,D */
        "00" /* end of graph */);

    // Transactions: A(1,2), B(3,1), C(2,1), D(1,3), E(1,1). Deps: C->A, D->A, D->B, E->D.
    // In order: [D,A,B,E,C]. Internally serialized in order A,B,C,D,E.
    TestDepGraphSerialization<TestBitSet>(
        {{{1, 3}, {1, 2}}, {{1, 2}, {}}, {{3, 1}, {}}, {{1, 1}, {0}}, {{2, 1}, {1}}},
        "02" /* A size */
        "02" /* A fee */
        "00" /* A insertion position (no skips): A */
        "01" /* B size */
        "06" /* B fee */
        "01" /* B insertion position (skip B->A dependency): A,B */
        "01" /* C size */
        "04" /* C fee */
        "01" /* C->A dependency (skip C->B dependency) */
        "00" /* C insertion position (no skips): A,B,C */
        "03" /* D size */
        "02" /* D fee */
        "01" /* D->B dependency (skip D->C dependency) */
        "00" /* D->A dependency (no skips) */
        "03" /* D insertion position (skip C,B,A): D,A,B,C */
        "01" /* E size */
        "02" /* E fee */
        "00" /* E->D dependency (no skips) */
        "02" /* E insertion position (skip E->C dependency, E->B and E->A are implied,
                skip insertion C): D,A,B,E,C */
        "00" /* end of graph */
    );
}